

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O1

void __thiscall Assimp::FindInstancesProcess::Execute(FindInstancesProcess *this,aiScene *pScene)

{
  aiMesh *paVar1;
  aiMesh *orig;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  aiVector3D *paVar4;
  aiColor4D *paVar5;
  aiColor4D *paVar6;
  long lVar7;
  uint n;
  uint uVar8;
  int iVar9;
  Logger *pLVar10;
  void *pvVar11;
  uint *lookup;
  ulong uVar12;
  void *__s2;
  void *__s1;
  uint real;
  ulong uVar13;
  aiFace *paVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  ai_real aVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uint local_1f0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"FindInstancesProcess begin");
  uVar16 = (ulong)pScene->mNumMeshes;
  if (uVar16 != 0) {
    pvVar11 = operator_new__(uVar16 * 8);
    lookup = (uint *)operator_new__(uVar16 << 2);
    if (pScene->mNumMeshes == 0) {
      local_1f0 = 0;
      uVar8 = 0;
    }
    else {
      local_1f0 = 0;
      uVar20 = 0;
      do {
        uVar16 = (ulong)uVar20;
        paVar1 = pScene->mMeshes[uVar16];
        if (paVar1 == (aiMesh *)0x0) {
          __assert_fail("nullptr != in",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInstancesProcess.h"
                        ,0x41,"uint64_t Assimp::GetMeshHash(aiMesh *)");
        }
        uVar8 = GetMeshVFormatUnique(paVar1);
        *(ulong *)((long)pvVar11 + uVar16 * 8) =
             CONCAT44(uVar8,paVar1->mPrimitiveTypes << 0x1c ^
                            paVar1->mMaterialIndex << 0xf ^ paVar1->mNumFaces << 4 ^
                            paVar1->mNumBones << 0x10 ^ paVar1->mNumVertices);
        aVar22 = ComputePositionEpsilon(paVar1);
        uVar8 = uVar20 - 1;
        if (-1 < (int)uVar8) {
          fVar27 = aVar22 * aVar22;
          do {
            uVar19 = (ulong)uVar8;
            if (*(long *)((long)pvVar11 + uVar16 * 8) == *(long *)((long)pvVar11 + uVar19 * 8)) {
              orig = pScene->mMeshes[uVar19];
              iVar9 = 7;
              if (((((orig != (aiMesh *)0x0) && (orig->mNumBones == paVar1->mNumBones)) &&
                   (orig->mNumFaces == paVar1->mNumFaces)) &&
                  ((uVar17 = (ulong)orig->mNumVertices, orig->mNumVertices == paVar1->mNumVertices
                   && (orig->mMaterialIndex == paVar1->mMaterialIndex)))) &&
                 (orig->mPrimitiveTypes == paVar1->mPrimitiveTypes)) {
                paVar2 = orig->mVertices;
                if (uVar17 == 0 || paVar2 == (aiVector3D *)0x0) {
LAB_0070d1be:
                  paVar2 = orig->mNormals;
                  if (paVar2 == (aiVector3D *)0x0 || uVar17 == 0) {
LAB_0070d273:
                    if (((uVar17 == 0) || (paVar2 = orig->mTangents, paVar2 == (aiVector3D *)0x0))
                       || (paVar3 = orig->mBitangents, paVar3 == (aiVector3D *)0x0)) {
LAB_0070d3cb:
                      uVar12 = 0;
                      do {
                        if (orig->mTextureCoords[uVar12] == (aiVector3D *)0x0) goto LAB_0070d3e3;
                        uVar12 = uVar12 + 1;
                      } while (uVar12 != 8);
                      uVar12 = 8;
LAB_0070d3e3:
                      if ((int)uVar12 == 0) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = 0;
                        do {
                          paVar2 = orig->mTextureCoords[uVar13];
                          if (paVar2 != (aiVector3D *)0x0) {
                            bVar21 = uVar17 == 0;
                            if ((uVar17 != 0) &&
                               (paVar3 = paVar1->mTextureCoords[uVar13],
                               fVar23 = paVar2->x - paVar3->x, fVar24 = paVar2->y - paVar3->y,
                               fVar25 = paVar2->z - paVar3->z,
                               fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < 0.001)) {
                              lVar18 = 0;
                              do {
                                bVar21 = uVar17 * 0xc + -0xc == lVar18;
                                if (bVar21) break;
                                fVar23 = *(float *)((long)&paVar2[1].x + lVar18) -
                                         *(float *)((long)&paVar3[1].x + lVar18);
                                fVar24 = *(float *)((long)&paVar2[1].y + lVar18) -
                                         *(float *)((long)&paVar3[1].y + lVar18);
                                fVar25 = *(float *)((long)&paVar2[1].z + lVar18) -
                                         *(float *)((long)&paVar3[1].z + lVar18);
                                lVar18 = lVar18 + 0xc;
                              } while (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < 0.001);
                            }
                            if (!bVar21) goto LAB_0070d4da;
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar13 != (uVar12 & 0xffffffff));
                        uVar13 = uVar12 & 0xffffffff;
                      }
LAB_0070d4da:
                      iVar9 = 7;
                      if ((int)uVar13 == (int)uVar12) {
                        uVar12 = 0;
                        do {
                          if (orig->mColors[uVar12] == (aiColor4D *)0x0) goto LAB_0070d509;
                          uVar12 = uVar12 + 1;
                        } while (uVar12 != 8);
                        uVar12 = 8;
LAB_0070d509:
                        if ((int)uVar12 == 0) {
                          uVar13 = 0;
                        }
                        else {
                          uVar13 = 0;
                          do {
                            paVar5 = orig->mColors[uVar13];
                            if (paVar5 != (aiColor4D *)0x0) {
                              bVar21 = uVar17 == 0;
                              if (uVar17 != 0) {
                                paVar6 = paVar1->mColors[uVar13];
                                lVar18 = 0;
                                do {
                                  fVar23 = *(float *)((long)&paVar5->r + lVar18) -
                                           *(float *)((long)&paVar6->r + lVar18);
                                  fVar24 = *(float *)((long)&paVar5->g + lVar18) -
                                           *(float *)((long)&paVar6->g + lVar18);
                                  fVar25 = *(float *)((long)&paVar5->b + lVar18) -
                                           *(float *)((long)&paVar6->b + lVar18);
                                  fVar26 = *(float *)((long)&paVar5->a + lVar18) -
                                           *(float *)((long)&paVar6->a + lVar18);
                                  if (0.001 <= fVar26 * fVar26 +
                                               fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24)
                                  break;
                                  bVar21 = (aiColor4D *)((long)&paVar5[1].r + lVar18) ==
                                           paVar5 + uVar17;
                                  lVar18 = lVar18 + 0x10;
                                } while (!bVar21);
                              }
                              if (!bVar21) goto LAB_0070d5d4;
                            }
                            uVar13 = uVar13 + 1;
                          } while (uVar13 != (uVar12 & 0xffffffff));
                          uVar13 = uVar12 & 0xffffffff;
                        }
LAB_0070d5d4:
                        iVar9 = 7;
                        if ((int)uVar13 == (int)uVar12) {
                          if (this->configSpeedFlag == false) {
                            bVar21 = CompareBones(orig,paVar1);
                            iVar9 = 7;
                            if (bVar21) {
                              __s2 = operator_new__(uVar17 << 2);
                              __s1 = operator_new__((ulong)orig->mNumVertices << 2);
                              if (orig->mNumFaces != 0) {
                                uVar17 = 0;
                                do {
                                  if (orig->mFaces[uVar17].mNumIndices != 0) {
                                    paVar14 = orig->mFaces + uVar17;
                                    uVar12 = 0;
                                    do {
                                      *(int *)((long)__s2 + (ulong)paVar14->mIndices[uVar12] * 4) =
                                           (int)uVar17;
                                      uVar12 = uVar12 + 1;
                                    } while (uVar12 < paVar14->mNumIndices);
                                  }
                                  if (paVar1->mFaces[uVar17].mNumIndices != 0) {
                                    paVar14 = paVar1->mFaces + uVar17;
                                    uVar12 = 0;
                                    do {
                                      *(int *)((long)__s1 + (ulong)paVar14->mIndices[uVar12] * 4) =
                                           (int)uVar17;
                                      uVar12 = uVar12 + 1;
                                    } while (uVar12 < paVar14->mNumIndices);
                                  }
                                  uVar17 = uVar17 + 1;
                                } while (uVar17 < orig->mNumFaces);
                              }
                              iVar9 = bcmp(__s1,__s2,(ulong)orig->mNumVertices << 2);
                              operator_delete__(__s1);
                              operator_delete__(__s2);
                              if (iVar9 == 0) goto LAB_0070d5fc;
                              iVar9 = 7;
                            }
                          }
                          else {
LAB_0070d5fc:
                            lookup[uVar16] = lookup[uVar19];
                            aiMesh::~aiMesh(paVar1);
                            operator_delete(paVar1,0x520);
                            pScene->mMeshes[uVar16] = (aiMesh *)0x0;
                            iVar9 = 5;
                          }
                        }
                      }
                    }
                    else {
                      paVar4 = paVar1->mTangents;
                      fVar23 = paVar2->x - paVar4->x;
                      fVar24 = paVar2->y - paVar4->y;
                      fVar25 = paVar2->z - paVar4->z;
                      if (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27) {
                        lVar18 = uVar17 * 0xc + -0xc;
                        lVar7 = 0;
                        do {
                          lVar15 = lVar7;
                          if (lVar18 == lVar15) goto LAB_0070d33a;
                          fVar23 = *(float *)((long)&paVar2[1].x + lVar15) -
                                   *(float *)((long)&paVar4[1].x + lVar15);
                          fVar24 = *(float *)((long)&paVar2[1].y + lVar15) -
                                   *(float *)((long)&paVar4[1].y + lVar15);
                          fVar25 = *(float *)((long)&paVar2[1].z + lVar15) -
                                   *(float *)((long)&paVar4[1].z + lVar15);
                          lVar7 = lVar15 + 0xc;
                        } while (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27);
                        if (lVar18 == lVar15) {
LAB_0070d33a:
                          paVar2 = paVar1->mBitangents;
                          fVar23 = paVar3->x - paVar2->x;
                          fVar24 = paVar3->y - paVar2->y;
                          fVar25 = paVar3->z - paVar2->z;
                          if (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27) {
                            lVar7 = 0;
                            do {
                              lVar15 = lVar7;
                              if (lVar18 == lVar15) goto LAB_0070d3cb;
                              fVar23 = *(float *)((long)&paVar3[1].x + lVar15) -
                                       *(float *)((long)&paVar2[1].x + lVar15);
                              fVar24 = *(float *)((long)&paVar3[1].y + lVar15) -
                                       *(float *)((long)&paVar2[1].y + lVar15);
                              fVar25 = *(float *)((long)&paVar3[1].z + lVar15) -
                                       *(float *)((long)&paVar2[1].z + lVar15);
                              lVar7 = lVar15 + 0xc;
                            } while (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27);
                            if (lVar18 == lVar15) goto LAB_0070d3cb;
                          }
                        }
                      }
                    }
                  }
                  else {
                    paVar3 = paVar1->mNormals;
                    fVar23 = paVar2->x - paVar3->x;
                    fVar24 = paVar2->y - paVar3->y;
                    fVar25 = paVar2->z - paVar3->z;
                    if (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27) {
                      lVar18 = uVar17 * 0xc + -0xc;
                      lVar7 = 0;
                      do {
                        lVar15 = lVar7;
                        if (lVar18 == lVar15) goto LAB_0070d273;
                        fVar23 = *(float *)((long)&paVar2[1].x + lVar15) -
                                 *(float *)((long)&paVar3[1].x + lVar15);
                        fVar24 = *(float *)((long)&paVar2[1].y + lVar15) -
                                 *(float *)((long)&paVar3[1].y + lVar15);
                        fVar25 = *(float *)((long)&paVar2[1].z + lVar15) -
                                 *(float *)((long)&paVar3[1].z + lVar15);
                        lVar7 = lVar15 + 0xc;
                      } while (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27);
                      if (lVar18 == lVar15) goto LAB_0070d273;
                    }
                  }
                }
                else {
                  paVar3 = paVar1->mVertices;
                  fVar23 = paVar2->x - paVar3->x;
                  fVar24 = paVar2->y - paVar3->y;
                  fVar25 = paVar2->z - paVar3->z;
                  if (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27) {
                    lVar18 = uVar17 * 0xc + -0xc;
                    lVar7 = 0;
                    do {
                      lVar15 = lVar7;
                      if (lVar18 == lVar15) goto LAB_0070d1be;
                      fVar23 = *(float *)((long)&paVar2[1].x + lVar15) -
                               *(float *)((long)&paVar3[1].x + lVar15);
                      fVar24 = *(float *)((long)&paVar2[1].y + lVar15) -
                               *(float *)((long)&paVar3[1].y + lVar15);
                      fVar25 = *(float *)((long)&paVar2[1].z + lVar15) -
                               *(float *)((long)&paVar3[1].z + lVar15);
                      lVar7 = lVar15 + 0xc;
                    } while (fVar25 * fVar25 + fVar23 * fVar23 + fVar24 * fVar24 < fVar27);
                    if (lVar18 == lVar15) goto LAB_0070d1be;
                  }
                }
              }
              if (iVar9 != 7) break;
            }
            uVar8 = uVar8 - 1;
          } while (-1 < (int)uVar8);
        }
        if (pScene->mMeshes[uVar16] != (aiMesh *)0x0) {
          lookup[uVar16] = local_1f0;
          local_1f0 = local_1f0 + 1;
        }
        uVar20 = uVar20 + 1;
        uVar8 = pScene->mNumMeshes;
      } while (uVar20 < uVar8);
    }
    if (local_1f0 == 0) {
      __assert_fail("0 != numMeshesOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/FindInstancesProcess.cpp"
                    ,0x100,"virtual void Assimp::FindInstancesProcess::Execute(aiScene *)");
    }
    if (local_1f0 == uVar8) {
      pLVar10 = DefaultLogger::get();
      Logger::debug(pLVar10,"FindInstancesProcess finished. No instanced meshes found");
    }
    else {
      uVar8 = 0;
      uVar20 = 0;
      do {
        paVar1 = pScene->mMeshes[uVar8];
        if (paVar1 != (aiMesh *)0x0) {
          uVar16 = (ulong)uVar20;
          uVar20 = uVar20 + 1;
          pScene->mMeshes[uVar16] = paVar1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar20 < local_1f0);
      UpdateMeshIndices(pScene->mRootNode,lookup);
      bVar21 = DefaultLogger::isNullLogger();
      if (!bVar21) {
        pLVar10 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[38]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [38])"FindInstancesProcess finished. Found ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," instances",10);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar10,(char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      pScene->mNumMeshes = local_1f0;
    }
    operator_delete__(lookup);
    operator_delete__(pvVar11);
  }
  return;
}

Assistant:

void FindInstancesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FindInstancesProcess begin");
    if (pScene->mNumMeshes) {

        // use a pseudo hash for all meshes in the scene to quickly find
        // the ones which are possibly equal. This step is executed early
        // in the pipeline, so we could, depending on the file format,
        // have several thousand small meshes. That's too much for a brute
        // everyone-against-everyone check involving up to 10 comparisons
        // each.
        std::unique_ptr<uint64_t[]> hashes (new uint64_t[pScene->mNumMeshes]);
        std::unique_ptr<unsigned int[]> remapping (new unsigned int[pScene->mNumMeshes]);

        unsigned int numMeshesOut = 0;
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

            aiMesh* inst = pScene->mMeshes[i];
            hashes[i] = GetMeshHash(inst);

            // Find an appropriate epsilon 
            // to compare position differences against
            float epsilon = ComputePositionEpsilon(inst);
            epsilon *= epsilon;

            for (int a = i-1; a >= 0; --a) {
                if (hashes[i] == hashes[a])
                {
                    aiMesh* orig = pScene->mMeshes[a];
                    if (!orig)
                        continue;

                    // check for hash collision .. we needn't check
                    // the vertex format, it *must* match due to the
                    // (brilliant) construction of the hash
                    if (orig->mNumBones       != inst->mNumBones      ||
                        orig->mNumFaces       != inst->mNumFaces      ||
                        orig->mNumVertices    != inst->mNumVertices   ||
                        orig->mMaterialIndex  != inst->mMaterialIndex ||
                        orig->mPrimitiveTypes != inst->mPrimitiveTypes)
                        continue;

                    // up to now the meshes are equal. Now compare vertex positions, normals,
                    // tangents and bitangents using this epsilon.
                    if (orig->HasPositions()) {
                        if(!CompareArrays(orig->mVertices,inst->mVertices,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasNormals()) {
                        if(!CompareArrays(orig->mNormals,inst->mNormals,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasTangentsAndBitangents()) {
                        if (!CompareArrays(orig->mTangents,inst->mTangents,orig->mNumVertices,epsilon) ||
                            !CompareArrays(orig->mBitangents,inst->mBitangents,orig->mNumVertices,epsilon))
                            continue;
                    }

                    // use a constant epsilon for colors and UV coordinates
                    static const float uvEpsilon = 10e-4f;
                    {
                        unsigned int j, end = orig->GetNumUVChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mTextureCoords[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mTextureCoords[j],inst->mTextureCoords[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }
                    {
                        unsigned int j, end = orig->GetNumColorChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mColors[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mColors[j],inst->mColors[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }

                    // These two checks are actually quite expensive and almost *never* required.
                    // Almost. That's why they're still here. But there's no reason to do them
                    // in speed-targeted imports.
                    if (!configSpeedFlag) {

                        // It seems to be strange, but we really need to check whether the
                        // bones are identical too. Although it's extremely unprobable
                        // that they're not if control reaches here, we need to deal
                        // with unprobable cases, too. It could still be that there are
                        // equal shapes which are deformed differently.
                        if (!CompareBones(orig,inst))
                            continue;

                        // For completeness ... compare even the index buffers for equality
                        // face order & winding order doesn't care. Input data is in verbose format.
                        std::unique_ptr<unsigned int[]> ftbl_orig(new unsigned int[orig->mNumVertices]);
                        std::unique_ptr<unsigned int[]> ftbl_inst(new unsigned int[orig->mNumVertices]);

                        for (unsigned int tt = 0; tt < orig->mNumFaces;++tt) {
                            aiFace& f = orig->mFaces[tt];
                            for (unsigned int nn = 0; nn < f.mNumIndices;++nn)
                                ftbl_orig[f.mIndices[nn]] = tt;

                            aiFace& f2 = inst->mFaces[tt];
                            for (unsigned int nn = 0; nn < f2.mNumIndices;++nn)
                                ftbl_inst[f2.mIndices[nn]] = tt;
                        }
                        if (0 != ::memcmp(ftbl_inst.get(),ftbl_orig.get(),orig->mNumVertices*sizeof(unsigned int)))
                            continue;
                    }

                    // We're still here. Or in other words: 'inst' is an instance of 'orig'.
                    // Place a marker in our list that we can easily update mesh indices.
                    remapping[i] = remapping[a];

                    // Delete the instanced mesh, we don't need it anymore
                    delete inst;
                    pScene->mMeshes[i] = NULL;
                    break;
                }
            }

            // If we didn't find a match for the current mesh: keep it
            if (pScene->mMeshes[i]) {
                remapping[i] = numMeshesOut++;
            }
        }
        ai_assert(0 != numMeshesOut);
        if (numMeshesOut != pScene->mNumMeshes) {

            // Collapse the meshes array by removing all NULL entries
            for (unsigned int real = 0, i = 0; real < numMeshesOut; ++i) {
                if (pScene->mMeshes[i])
                    pScene->mMeshes[real++] = pScene->mMeshes[i];
            }

            // And update the node graph with our nice lookup table
            UpdateMeshIndices(pScene->mRootNode,remapping.get());

            // write to log
            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_INFO_F( "FindInstancesProcess finished. Found ", (pScene->mNumMeshes - numMeshesOut), " instances" );
            }
            pScene->mNumMeshes = numMeshesOut;
        } else {
            ASSIMP_LOG_DEBUG("FindInstancesProcess finished. No instanced meshes found");
        }
    }
}